

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
resize(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      size_t new_size)

{
  unit_t *puVar1;
  uchar *puVar2;
  
  puVar1 = _resize<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::unit_t>
                     (this->array_,this->alloc_size_,new_size,(unit_t)0x0);
  this->array_ = puVar1;
  puVar2 = _resize<unsigned_char>(this->used_,this->alloc_size_,new_size,'\0');
  this->used_ = puVar2;
  this->alloc_size_ = new_size;
  return new_size;
}

Assistant:

size_t resize(const size_t new_size) {
    unit_t tmp;
    tmp.base = 0;
    tmp.check = 0;
    array_ = _resize(array_, alloc_size_, new_size, tmp);
    used_  = _resize(used_, alloc_size_, new_size,
                     static_cast<unsigned char>(0));
    alloc_size_ = new_size;
    return new_size;
  }